

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O3

void __thiscall Liby::PollerEpoll::PollerEpoll(PollerEpoll *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FileDescriptor *pFVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  Logger *this_01;
  int *piVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined1 local_29;
  FileDescriptor *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  Poller::Poller(&this->super_Poller);
  (this->super_Poller)._vptr_Poller = (_func_int **)&PTR__PollerEpoll_0012d480;
  this->pollerfd_ = -1;
  this->eventsSize_ = 0;
  (this->pollerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pollerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = epoll_create1(0x80000);
  this->pollerfd_ = iVar3;
  if (0 < iVar3) {
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::FileDescriptor,std::allocator<Liby::FileDescriptor>,int&>
              (&_Stack_20,&local_28,(allocator<Liby::FileDescriptor> *)&local_29,&this->pollerfd_);
    _Var2._M_pi = _Stack_20._M_pi;
    pFVar1 = local_28;
    local_28 = (FileDescriptor *)0x0;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->pollerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->pollerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pFVar1;
    (this->pollerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      }
    }
    std::vector<epoll_event,_std::allocator<epoll_event>_>::resize(&this->events_,0x30);
    return;
  }
  this_01 = Logger::getLogger();
  piVar4 = __errno_location();
  strerror(*piVar4);
  Logger::log(this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  exit(1);
}

Assistant:

PollerEpoll::PollerEpoll() {
    pollerfd_ = ::epoll_create1(EPOLL_CLOEXEC);
    fatalif(pollerfd_ <= 0, "%s", ::strerror(errno));
    pollerfp_ = std::make_shared<FileDescriptor>(pollerfd_);

    events_.resize(defaultEpollSize);
}